

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O2

void __thiscall
CTPNStmEnclosing::gen_code_unwind_for_goto
          (CTPNStmEnclosing *this,CTPNStmGoto *goto_stm,CTPNStmLabel *target)

{
  int iVar1;
  CTPNStmLabel *pCVar2;
  CTPNStmLabel *pCVar3;
  
  pCVar2 = target;
  do {
    for (; pCVar2 != (CTPNStmLabel *)0x0;
        pCVar2 = (CTPNStmLabel *)(pCVar2->super_CTPNStmLabelBase).super_CTPNStmEnclosing.enclosing_)
    {
      pCVar3 = target;
      if (pCVar2 == (CTPNStmLabel *)this) {
        while( true ) {
          if (pCVar3 == (CTPNStmLabel *)0x0) {
            return;
          }
          if (pCVar3 == (CTPNStmLabel *)this) break;
          iVar1 = (*(pCVar3->super_CTPNStmLabelBase).super_CTPNStmEnclosing.super_CTPNStm.
                    super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
                    [0x24])(pCVar3,goto_stm,target);
          if (iVar1 == 0) {
            return;
          }
          pCVar3 = (CTPNStmLabel *)
                   (pCVar3->super_CTPNStmLabelBase).super_CTPNStmEnclosing.enclosing_;
        }
        return;
      }
    }
    (*(((CTPNStmLabel *)this)->super_CTPNStmLabelBase).super_CTPNStmEnclosing.super_CTPNStm.
      super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x23])(this);
    this = (((CTPNStmLabel *)this)->super_CTPNStmLabelBase).super_CTPNStmEnclosing.enclosing_;
    pCVar2 = target;
  } while ((CTPNStmLabel *)this != (CTPNStmLabel *)0x0);
  while ((pCVar2 != (CTPNStmLabel *)0x0 &&
         (iVar1 = (*(pCVar2->super_CTPNStmLabelBase).super_CTPNStmEnclosing.super_CTPNStm.
                    super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
                    [0x24])(pCVar2,goto_stm,target), iVar1 != 0))) {
    pCVar2 = (CTPNStmLabel *)(pCVar2->super_CTPNStmLabelBase).super_CTPNStmEnclosing.enclosing_;
  }
  return;
}

Assistant:

void CTPNStmEnclosing::gen_code_unwind_for_goto(CTPNStmGoto *goto_stm,
                                                CTPNStmLabel *target)
{
    CTPNStmEnclosing *enc;
    
    /* 
     *   Detmerine if the target statement is enclosed within this
     *   statement.  If it is, we do not need to unwind from this
     *   statement or any of its enclosing statements, because control
     *   will remain within this statement.
     *   
     *   To make this determination, start at the target label and search
     *   up its list of enclosing statements.  If we reach 'this', we know
     *   that we enclose the target.  If we reach the outermost enclosing
     *   statement, we know that we do not enclose the taret.  
     */
    for (enc = target ; enc != 0 ; enc = enc->get_enclosing())
    {
        /* 
         *   if we found ourself in the list of enclosing statements
         *   around the target label, the label is contained within us,
         *   hence we do not need to generate any code to leave, because
         *   we're not leaving - simply return immediately without looking
         *   any further 
         */
        if (enc == this)
        {
            /*
             *   'this' is the common ancestor of both the 'goto' and the
             *   target label, so we're not transferring control in or out
             *   of 'this' or any enclosing statement.  However, we are
             *   transfering control IN through all of the statements that
             *   enclose the label up to but not including 'this'.
             *   
             *   Some types of statements do not allow control transfers
             *   in to enclosed labels - in particular, we can't use
             *   'goto' to transfer control into a 'finally' clause.
             *   Check all statements that enclose the label up to but not
             *   including 'this', and make sure they will allow a
             *   transfer in.
             *   
             *   Note that we make this check now, only after we've found
             *   the common ancestor, because we can't tell if we're
             *   actually entering any blocks until we find the common
             *   ancestor.  
             */
            for (enc = target ; enc != 0 && enc != this ;
                 enc = enc->get_enclosing())
            {
                /* make sure we're allowed to enter this statement */
                if (!enc->check_enter_by_goto(goto_stm, target))
                    break;
            }

            /* 
             *   we're not transferring out of this statement or any
             *   enclosing statement, since the source 'goto' and the
             *   target label are both contained within 'this' - we're
             *   done unwinding for the transfer 
             */
            return;
        }
    }

    /* generate code to transfer out of this statement */
    gen_code_for_transfer_out();

    /* check for an enclosing statement */
    if (enclosing_ != 0)
    {
        /* 
         *   We are enclosed by another statement or statements.  This
         *   means that we haven't found a common ancestor yet, so we
         *   might be leaving the enclosing block as well - continue on to
         *   our enclosing statement.  
         */
        enclosing_->gen_code_unwind_for_goto(goto_stm, target);
    }
    else
    {
        /*
         *   This is the outermost significant enclosing statement, which
         *   means that we are transferring control into a completely
         *   unrelated block.  As a result, we will enter every statement
         *   that encloses the target label.
         *   
         *   We must check each block we're entering to see if it allows
         *   entry by 'goto' statements.  Since we now know there is no
         *   common ancestor, and thus that we're entering every block
         *   enclosing the target label, we must check every block
         *   enclosing the target label to see if they allow transfers in
         *   via 'goto' statements.  
         */
        for (enc = target ; enc != 0 ; enc = enc->get_enclosing())
        {
            /* make sure we're allowed to enter this statement */
            if (!enc->check_enter_by_goto(goto_stm, target))
                break;
        }
    }
}